

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O2

TA_RetCode
TA_BBANDS_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_ParamHolderOptInput *pTVar1;
  TA_ParamHolderOutput *pTVar2;
  TA_RetCode TVar3;
  
  pTVar1 = params->optIn;
  pTVar2 = params->out;
  TVar3 = TA_BBANDS(startIdx,endIdx,(params->in->data).inReal,(pTVar1->data).optInInteger,
                    pTVar1[1].data.optInReal,pTVar1[2].data.optInReal,pTVar1[3].data.optInInteger,
                    outBegIdx,outNBElement,(pTVar2->data).outReal,pTVar2[1].data.outReal,
                    pTVar2[2].data.outReal);
  return TVar3;
}

Assistant:

TA_RetCode TA_BBANDS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_BBANDS(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inReal, /* inReal */
/* Generated */                params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                params->optIn[1].data.optInReal, /* optInNbDevUp*/
/* Generated */                params->optIn[2].data.optInReal, /* optInNbDevDn*/
/* Generated */                (TA_MAType)params->optIn[3].data.optInInteger, /* optInMAType*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal, /*  outRealUpperBand */
/* Generated */                params->out[1].data.outReal, /*  outRealMiddleBand */
/* Generated */                params->out[2].data.outReal /*  outRealLowerBand */ );
/* Generated */ }